

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muhash.cpp
# Opt level: O0

Num3072 * __thiscall Num3072::GetInverse(Num3072 *__return_storage_ptr__,Num3072 *this)

{
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffed98;
  undefined4 uVar1;
  undefined4 in_stack_ffffffffffffed9c;
  undefined4 uVar2;
  undefined8 in_stack_ffffffffffffeda0;
  int iVar3;
  undefined4 in_stack_ffffffffffffeda8;
  undefined4 in_stack_ffffffffffffedac;
  undefined4 uVar4;
  Num3072 *this_00;
  Num3072 *local_1220;
  int j;
  int i;
  Num3072 *this_local;
  Num3072 p [12];
  limb_t local_8;
  
  p[1].limbs[0x11] = 0;
  local_8 = *(limb_t *)(in_FS_OFFSET + 0x28);
  local_1220 = p;
  this_00 = __return_storage_ptr__;
  do {
    Num3072((Num3072 *)CONCAT44(in_stack_ffffffffffffed9c,in_stack_ffffffffffffed98));
    local_1220 = local_1220 + 1;
  } while (local_1220 != (Num3072 *)&stack0xfffffffffffffff8);
  Num3072((Num3072 *)CONCAT44(in_stack_ffffffffffffed9c,in_stack_ffffffffffffed98));
  memcpy(p,this,0x180);
  for (i = 0; iVar3 = (int)((ulong)in_stack_ffffffffffffeda0 >> 0x20), i < 0xb; i = i + 1) {
    memcpy(p + (i + 1),p + i,0x180);
    for (j = 0; j < 1 << ((byte)i & 0x1f); j = j + 1) {
      Square(this_00);
    }
    Multiply(this_00,__return_storage_ptr__);
  }
  memcpy(__return_storage_ptr__,p + 0xb,0x180);
  anon_unknown.dwarf_35de1b1::square_n_mul
            ((Num3072 *)CONCAT44(in_stack_ffffffffffffedac,in_stack_ffffffffffffeda8),iVar3,
             (Num3072 *)CONCAT44(in_stack_ffffffffffffed9c,in_stack_ffffffffffffed98));
  anon_unknown.dwarf_35de1b1::square_n_mul
            ((Num3072 *)CONCAT44(in_stack_ffffffffffffedac,in_stack_ffffffffffffeda8),iVar3,
             (Num3072 *)CONCAT44(in_stack_ffffffffffffed9c,in_stack_ffffffffffffed98));
  anon_unknown.dwarf_35de1b1::square_n_mul
            ((Num3072 *)CONCAT44(in_stack_ffffffffffffedac,in_stack_ffffffffffffeda8),iVar3,
             (Num3072 *)CONCAT44(in_stack_ffffffffffffed9c,in_stack_ffffffffffffed98));
  anon_unknown.dwarf_35de1b1::square_n_mul
            ((Num3072 *)CONCAT44(in_stack_ffffffffffffedac,in_stack_ffffffffffffeda8),iVar3,
             (Num3072 *)CONCAT44(in_stack_ffffffffffffed9c,in_stack_ffffffffffffed98));
  anon_unknown.dwarf_35de1b1::square_n_mul
            ((Num3072 *)CONCAT44(in_stack_ffffffffffffedac,in_stack_ffffffffffffeda8),iVar3,
             (Num3072 *)CONCAT44(in_stack_ffffffffffffed9c,in_stack_ffffffffffffed98));
  anon_unknown.dwarf_35de1b1::square_n_mul
            ((Num3072 *)CONCAT44(in_stack_ffffffffffffedac,in_stack_ffffffffffffeda8),iVar3,
             (Num3072 *)CONCAT44(in_stack_ffffffffffffed9c,in_stack_ffffffffffffed98));
  uVar1 = 2;
  iVar3 = (int)((ulong)(p + 1) >> 0x20);
  anon_unknown.dwarf_35de1b1::square_n_mul
            ((Num3072 *)CONCAT44(in_stack_ffffffffffffedac,in_stack_ffffffffffffeda8),iVar3,
             (Num3072 *)CONCAT44(in_stack_ffffffffffffed9c,2));
  anon_unknown.dwarf_35de1b1::square_n_mul
            ((Num3072 *)CONCAT44(in_stack_ffffffffffffedac,in_stack_ffffffffffffeda8),iVar3,
             (Num3072 *)CONCAT44(in_stack_ffffffffffffed9c,uVar1));
  anon_unknown.dwarf_35de1b1::square_n_mul
            ((Num3072 *)CONCAT44(in_stack_ffffffffffffedac,in_stack_ffffffffffffeda8),iVar3,
             (Num3072 *)CONCAT44(in_stack_ffffffffffffed9c,uVar1));
  uVar4 = 3;
  anon_unknown.dwarf_35de1b1::square_n_mul
            ((Num3072 *)CONCAT44(3,in_stack_ffffffffffffeda8),iVar3,
             (Num3072 *)CONCAT44(in_stack_ffffffffffffed9c,uVar1));
  anon_unknown.dwarf_35de1b1::square_n_mul
            ((Num3072 *)CONCAT44(uVar4,in_stack_ffffffffffffeda8),iVar3,
             (Num3072 *)CONCAT44(in_stack_ffffffffffffed9c,uVar1));
  uVar2 = 4;
  anon_unknown.dwarf_35de1b1::square_n_mul
            ((Num3072 *)CONCAT44(uVar4,in_stack_ffffffffffffeda8),iVar3,(Num3072 *)CONCAT44(4,uVar1)
            );
  anon_unknown.dwarf_35de1b1::square_n_mul
            ((Num3072 *)CONCAT44(uVar4,in_stack_ffffffffffffeda8),iVar3,
             (Num3072 *)CONCAT44(uVar2,uVar1));
  anon_unknown.dwarf_35de1b1::square_n_mul
            ((Num3072 *)CONCAT44(uVar4,in_stack_ffffffffffffeda8),iVar3,
             (Num3072 *)CONCAT44(uVar2,uVar1));
  if (*(limb_t *)(in_FS_OFFSET + 0x28) == local_8) {
    return this_00;
  }
  __stack_chk_fail();
}

Assistant:

Num3072 Num3072::GetInverse() const
{
    // For fast exponentiation a sliding window exponentiation with repunit
    // precomputation is utilized. See "Fast Point Decompression for Standard
    // Elliptic Curves" (Brumley, Järvinen, 2008).

    Num3072 p[12]; // p[i] = a^(2^(2^i)-1)
    Num3072 out;

    p[0] = *this;

    for (int i = 0; i < 11; ++i) {
        p[i + 1] = p[i];
        for (int j = 0; j < (1 << i); ++j) p[i + 1].Square();
        p[i + 1].Multiply(p[i]);
    }

    out = p[11];

    square_n_mul(out, 512, p[9]);
    square_n_mul(out, 256, p[8]);
    square_n_mul(out, 128, p[7]);
    square_n_mul(out, 64, p[6]);
    square_n_mul(out, 32, p[5]);
    square_n_mul(out, 8, p[3]);
    square_n_mul(out, 2, p[1]);
    square_n_mul(out, 1, p[0]);
    square_n_mul(out, 5, p[2]);
    square_n_mul(out, 3, p[0]);
    square_n_mul(out, 2, p[0]);
    square_n_mul(out, 4, p[0]);
    square_n_mul(out, 4, p[1]);
    square_n_mul(out, 3, p[0]);

    return out;
}